

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int main(void)

{
  undefined8 __s2;
  _Bool _Var1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  long local_288;
  size_t len_1;
  char *t_6;
  char local_26e;
  char local_26d;
  uint32_t a_9;
  uint8_t a_8;
  uint uStack_268;
  uint8_t t_5;
  uint16_t a_7;
  uint16_t t_4;
  uint32_t a_6;
  uint32_t t_3;
  uint64_t a_5;
  uint64_t t_2;
  char local_247;
  short local_246;
  uint32_t a_4;
  uint8_t a_3;
  uint16_t a_2;
  ulong uStack_240;
  uint32_t a_1;
  uint64_t a;
  chck_buffer buf_6;
  undefined8 uStack_208;
  int i_2;
  chck_endianess tests_2 [2];
  uint32_t iters;
  uint8_t compressed [12];
  chck_buffer buf_5;
  char uncompressed [22];
  chck_buffer buf_4;
  char *str_1;
  int iStack_178;
  int t_1;
  chck_endianess tests_1 [2];
  int16_t s_1;
  long lStack_168;
  int32_t i_1;
  int64_t l;
  size_t len;
  chck_buffer buf_3;
  char *str;
  int local_120;
  int8_t c;
  int iStack_11c;
  int16_t s;
  int32_t i;
  int t;
  anon_struct_24_3_42d9abba tests [2];
  char *result;
  chck_buffer buf_2;
  char bb [33];
  undefined1 local_88 [8];
  char data [33];
  chck_buffer buf_1;
  chck_buffer buf;
  
  uVar4 = chck_buffer(&buf_1.endianess,1,2);
  if ((uVar4 & 1) == 0) {
    __assert_fail("chck_buffer(&buf, 1, CHCK_ENDIANESS_NATIVE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0xf,"int main(void)");
  }
  free((void *)buf_1._32_8_);
  chck_buffer_release(&buf_1.endianess);
  memcpy(local_88,"yolo I have only this many bytes",0x21);
  uVar4 = chck_buffer_from_pointer(data + 0x20,local_88,0x21,2);
  if ((uVar4 & 1) == 0) {
    __assert_fail("chck_buffer_from_pointer(&buf, data, sizeof(data), CHCK_ENDIANESS_NATIVE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x19,"int main(void)");
  }
  lVar5 = chck_buffer_read(&buf_2.endianess,1,0x21,data + 0x20);
  if (lVar5 != 0x21) {
    __assert_fail("chck_buffer_read(bb, 1, sizeof(data), &buf) == sizeof(data)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x1b,"int main(void)");
  }
  chck_buffer_seek(data + 0x20,0,0);
  lVar5 = chck_buffer_read(&buf_2.endianess,1,0x84,data + 0x20);
  if (lVar5 != 0x21) {
    __assert_fail("chck_buffer_read(bb, 1, sizeof(data) * 4, &buf) == sizeof(data)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x1d,"int main(void)");
  }
  chck_buffer_seek(data + 0x20,0,0);
  lVar5 = chck_buffer_read(&buf_2.endianess,8,0x21,data + 0x20);
  if (lVar5 != 4) {
    __assert_fail("chck_buffer_read(bb, 8, sizeof(data), &buf) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x1f,"int main(void)");
  }
  lVar5 = chck_buffer_read(&buf_2.endianess,0xc,0x21,data + 0x20);
  if (lVar5 != 0) {
    __assert_fail("chck_buffer_read(bb, 12, sizeof(data), &buf) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x20,"int main(void)");
  }
  lVar5 = chck_buffer_read(&buf_2.endianess,1,0x21,data + 0x20);
  if (lVar5 != 1) {
    __assert_fail("chck_buffer_read(bb, 1, sizeof(data), &buf) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x21,"int main(void)");
  }
  chck_buffer_release(data + 0x20);
  uVar4 = chck_buffer(&result,1,2);
  if ((uVar4 & 1) == 0) {
    __assert_fail("chck_buffer(&buf, 1, CHCK_ENDIANESS_NATIVE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x28,"int main(void)");
  }
  tests[1]._16_8_ = anon_var_dwarf_ea;
  sVar6 = chck_buffer_write_format
                    (&result,"Hello %s, I\'m in your buffer at %d:%.2d clock!","buffer",10,0);
  sVar7 = strlen((char *)tests[1]._16_8_);
  if (sVar6 != sVar7) {
    __assert_fail("chck_buffer_write_format(&buf, \"Hello %s, I\'m in your buffer at %d:%.2d clock!\", \"buffer\", 10, 0) == strlen(result)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x2a,"int main(void)");
  }
  chck_buffer_seek(&result,0,0);
  __s2 = tests[1]._16_8_;
  sVar6 = strlen((char *)tests[1]._16_8_);
  iVar3 = memcmp(result,(void *)__s2,sVar6);
  if (iVar3 != 0) {
    __assert_fail("!memcmp(buf.buffer, result, strlen(result))",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                  ,0x2c,"int main(void)");
  }
  chck_buffer_release(&result);
  memcpy(&i,&PTR_anon_var_dwarf_140_00104da0,0x30);
  iStack_11c = 0;
  while( true ) {
    if (1 < iStack_11c) {
      lStack_168 = 0x20;
      tests_1[1] = 8;
      tests_1[0]._2_2_ = 6;
      _iStack_178 = 0x100000002;
      str_1._4_4_ = 0;
      while( true ) {
        if (1 < str_1._4_4_) {
          buf_5.endianess = true;
          buf_5.copied = true;
          buf_5._34_1_ = '.';
          buf_5._35_1_ = '.';
          buf_5._36_1_ = '.';
          buf_5._37_1_ = '.';
          buf_5._38_1_ = '.';
          buf_5._39_1_ = '.';
          builtin_strncpy(uncompressed,".............",0xe);
          chck_buffer_from_pointer(compressed + 4,&buf_5.endianess,0x16,2);
          stack0xfffffffffffffe04 = 0x1802c3d3d39c78;
          compressed[0] = '-';
          compressed[1] = '^';
          compressed[2] = '\x03';
          compressed[3] = 199;
          uVar4 = chck_buffer_has_zlib();
          if ((uVar4 & 1) == 0) {
            __assert_fail("chck_buffer_has_zlib()",
                          "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                          ,0x8d,"int main(void)");
          }
          uVar4 = chck_buffer_compress_zlib(compressed + 4);
          if ((uVar4 & 1) == 0) {
            __assert_fail("chck_buffer_compress_zlib(&buf)",
                          "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                          ,0x8e,"int main(void)");
          }
          if (buf_5.curpos != (uint8_t *)0xc) {
            __assert_fail("buf.size == sizeof(compressed)",
                          "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                          ,0x8f,"int main(void)");
          }
          iVar3 = memcmp((void *)compressed._4_8_,tests_2 + 1,0xc);
          if (iVar3 == 0) {
            uVar4 = chck_buffer_decompress_zlib(compressed + 4);
            if ((uVar4 & 1) == 0) {
              __assert_fail("chck_buffer_decompress_zlib(&buf)",
                            "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                            ,0x92,"int main(void)");
            }
            if (buf_5.curpos != (uint8_t *)0x16) {
              __assert_fail("buf.size == sizeof(uncompressed)",
                            "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                            ,0x93,"int main(void)");
            }
            iVar3 = memcmp((void *)compressed._4_8_,&buf_5.endianess,0x16);
            if (iVar3 != 0) {
              __assert_fail("memcmp(buf.buffer, uncompressed, sizeof(uncompressed)) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                            ,0x94,"int main(void)");
            }
            chck_buffer_release(compressed + 4);
            tests_2[0] = 0xfffff;
            uStack_208 = 0x100000002;
            buf_6._36_4_ = 0;
            do {
              if (1 < (int)buf_6._36_4_) {
                return 0;
              }
              uVar4 = chck_buffer(&a,0x3ffffc0,
                                  *(undefined4 *)
                                   ((long)&stack0xfffffffffffffdf8 + (long)(int)buf_6._36_4_ * 4));
              if ((uVar4 & 1) == 0) {
                __assert_fail("chck_buffer(&buf, iters * sizeof(uint64_t) * sizeof(uint32_t) * sizeof(uint16_t) * sizeof(uint8_t), tests[i])"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                              ,0xa3,"int main(void)");
              }
              for (uStack_240 = 0; uStack_240 < 0xfffff; uStack_240 = uStack_240 + 1) {
                uVar4 = chck_buffer_write_int(&stack0xfffffffffffffdc0,8,&a);
                if ((uVar4 & 1) == 0) {
                  __assert_fail("chck_buffer_write_int(&a, sizeof(a), &buf)",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xa4,"int main(void)");
                }
              }
              for (a_4 = 0; a_4 < 0xfffff; a_4 = a_4 + 1) {
                uVar4 = chck_buffer_write_int(&a_4,4,&a);
                if ((uVar4 & 1) == 0) {
                  __assert_fail("chck_buffer_write_int(&a, sizeof(a), &buf)",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xa5,"int main(void)");
                }
              }
              for (local_246 = 0; local_246 != -1; local_246 = local_246 + 1) {
                uVar4 = chck_buffer_write_int(&local_246,2,&a);
                if ((uVar4 & 1) == 0) {
                  __assert_fail("chck_buffer_write_int(&a, sizeof(a), &buf)",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xa6,"int main(void)");
                }
              }
              for (local_247 = '\0'; local_247 != -1; local_247 = local_247 + '\x01') {
                uVar4 = chck_buffer_write_int(&local_247,1,&a);
                if ((uVar4 & 1) == 0) {
                  __assert_fail("chck_buffer_write_int(&a, sizeof(a), &buf)",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xa7,"int main(void)");
                }
              }
              for (t_2._4_4_ = 0; t_2._4_4_ < 0xfffff; t_2._4_4_ = t_2._4_4_ + 1) {
                uVar4 = chck_buffer_write_string("yolo",4,&a);
                if ((uVar4 & 1) == 0) {
                  __assert_fail("chck_buffer_write_string(\"yolo\", 4, &buf)",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xa8,"int main(void)");
                }
              }
              chck_buffer_seek(&a,0,0);
              for (_a_6 = 0; _a_6 < 0xfffff; _a_6 = _a_6 + 1) {
                uVar4 = chck_buffer_read_int(&a_5,8,&a);
                if ((uVar4 & 1) == 0) {
                  __assert_fail("chck_buffer_read_int(&t, sizeof(t), &buf)",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xaa,"int main(void)");
                }
                if (_a_6 != a_5) {
                  __assert_fail("a == t",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xaa,"int main(void)");
                }
              }
              for (uStack_268 = 0; uStack_268 < 0xfffff; uStack_268 = uStack_268 + 1) {
                uVar4 = chck_buffer_read_int(&a_7,4,&a);
                if ((uVar4 & 1) == 0) {
                  __assert_fail("chck_buffer_read_int(&t, sizeof(t), &buf)",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xab,"int main(void)");
                }
                if (uStack_268 != _a_7) {
                  __assert_fail("a == t",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xab,"int main(void)");
                }
              }
              for (a_9._0_2_ = 0; (short)a_9 != -1; a_9._0_2_ = (short)a_9 + 1) {
                uVar4 = chck_buffer_read_int((long)&a_9 + 2,2,&a);
                if ((uVar4 & 1) == 0) {
                  __assert_fail("chck_buffer_read_int(&t, sizeof(t), &buf)",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xac,"int main(void)");
                }
                if ((short)a_9 != a_9._2_2_) {
                  __assert_fail("a == t",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xac,"int main(void)");
                }
              }
              for (local_26e = '\0'; local_26e != -1; local_26e = local_26e + '\x01') {
                uVar4 = chck_buffer_read_int(&local_26d,1,&a);
                if ((uVar4 & 1) == 0) {
                  __assert_fail("chck_buffer_read_int(&t, sizeof(t), &buf)",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xad,"int main(void)");
                }
                if (local_26e != local_26d) {
                  __assert_fail("a == t",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xad,"int main(void)");
                }
              }
              for (t_6._4_4_ = 0; t_6._4_4_ < 0xfffff; t_6._4_4_ = t_6._4_4_ + 1) {
                uVar4 = chck_buffer_read_string(&len_1,&local_288,&a);
                if ((uVar4 & 1) == 0) {
                  __assert_fail("chck_buffer_read_string(&t, &len, &buf)",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xb1,"int main(void)");
                }
                iVar3 = strcmp((char *)len_1,"yolo");
                if (iVar3 != 0) {
                  __assert_fail("!strcmp(t, \"yolo\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xb2,"int main(void)");
                }
                if (local_288 != 4) {
                  __assert_fail("len == 4",
                                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                                ,0xb3,"int main(void)");
                }
                free((void *)len_1);
              }
              chck_buffer_release(&a);
              buf_6._36_4_ = buf_6._36_4_ + 1;
            } while( true );
          }
          __assert_fail("memcmp(buf.buffer, compressed, sizeof(compressed)) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x90,"int main(void)");
        }
        uVar4 = chck_buffer(uncompressed + 0x10,0xb,(&iStack_178)[str_1._4_4_]);
        if ((uVar4 & 1) == 0) {
          __assert_fail("chck_buffer(&buf, 5+6, tests[t])",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x65,"int main(void)");
        }
        iVar3 = (&iStack_178)[str_1._4_4_];
        _Var1 = chck_buffer_native_endianess((chck_buffer *)(uncompressed + 0x10));
        if ((iVar3 == 2) != _Var1) {
          __assert_fail("(tests[t] == CHCK_ENDIANESS_NATIVE) == chck_buffer_native_endianess(&buf)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x66,"int main(void)");
        }
        bVar2 = chck_buffer_write_string("test",4,uncompressed + 0x10);
        if ((bVar2 & 1) != 1) {
          __assert_fail("chck_buffer_write_string(\"test\", 4, &buf) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x68,"int main(void)");
        }
        uVar4 = chck_buffer_write_string_of_type("test",4,1,uncompressed + 0x10);
        if ((uVar4 & 1) == 0) {
          __assert_fail("chck_buffer_write_string_of_type(\"test\", 4, sizeof(uint8_t), &buf)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x69,"int main(void)");
        }
        uVar4 = chck_buffer_resize(uncompressed + 0x10,0x19);
        if ((uVar4 & 1) == 0) {
          __assert_fail("chck_buffer_resize(&buf, 5+6+sizeof(uint64_t)+sizeof(int32_t)+sizeof(int16_t))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x6a,"int main(void)");
        }
        if (buf_4.curpos != (uint8_t *)0x19) {
          __assert_fail("buf.size == 5+6+sizeof(uint64_t)+sizeof(int32_t)+sizeof(int16_t)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x6b,"int main(void)");
        }
        if ((long)buf_4.buffer - (long)stack0xfffffffffffffe50 != 0xb) {
          __assert_fail("buf.curpos - buf.buffer == 6+5",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x6c,"int main(void)");
        }
        if (stack0xfffffffffffffe50 == buf_4.buffer) {
          __assert_fail("buf.buffer != buf.curpos",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x6d,"int main(void)");
        }
        uVar4 = chck_buffer_write_int(&stack0xfffffffffffffe98,8,uncompressed + 0x10);
        if ((uVar4 & 1) == 0) {
          __assert_fail("chck_buffer_write_int(&l, sizeof(l), &buf)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x6f,"int main(void)");
        }
        uVar4 = chck_buffer_write_int(tests_1 + 1,4,uncompressed + 0x10);
        if ((uVar4 & 1) == 0) {
          __assert_fail("chck_buffer_write_int(&i, sizeof(i), &buf)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x70,"int main(void)");
        }
        uVar4 = chck_buffer_write_int((byte *)((long)tests_1 + 2),2,uncompressed + 0x10);
        if ((uVar4 & 1) == 0) {
          __assert_fail("chck_buffer_write_int(&s, sizeof(s), &buf)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x71,"int main(void)");
        }
        if (buf_4.buffer + -(long)stack0xfffffffffffffe50 != buf_4.curpos) break;
        lVar5 = chck_buffer_seek(uncompressed + 0x10,0,0);
        if (lVar5 != (long)buf_4.buffer - (long)stack0xfffffffffffffe50) {
          __assert_fail("chck_buffer_seek(&buf, 0, SEEK_SET) == buf.curpos - buf.buffer",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x74,"int main(void)");
        }
        if (buf_4.buffer != stack0xfffffffffffffe50) {
          __assert_fail("buf.curpos - buf.buffer == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x75,"int main(void)");
        }
        uVar4 = chck_buffer_read_string(&buf_4.endianess,0,uncompressed + 0x10);
        if ((uVar4 & 1) == 0) {
          __assert_fail("chck_buffer_read_string(&str, NULL, &buf)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x77,"int main(void)");
        }
        iVar3 = strcmp((char *)buf_4._32_8_,"test");
        if (iVar3 != 0) {
          __assert_fail("strcmp(str, \"test\") == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x78,"int main(void)");
        }
        free((void *)buf_4._32_8_);
        uVar4 = chck_buffer_read_string_of_type(&buf_4.endianess,0,1,uncompressed + 0x10);
        if ((uVar4 & 1) == 0) {
          __assert_fail("chck_buffer_read_string_of_type(&str, NULL, sizeof(uint8_t), &buf)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x79,"int main(void)");
        }
        iVar3 = strcmp((char *)buf_4._32_8_,"test");
        if (iVar3 != 0) {
          __assert_fail("strcmp(str, \"test\") == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x7a,"int main(void)");
        }
        free((void *)buf_4._32_8_);
        uVar4 = chck_buffer_read_int(&stack0xfffffffffffffe98,8,uncompressed + 0x10);
        if ((uVar4 & 1) == 0) {
          __assert_fail("chck_buffer_read_int(&l, sizeof(l), &buf)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x7b,"int main(void)");
        }
        if (lStack_168 != 0x20) {
          __assert_fail("l == 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x7c,"int main(void)");
        }
        uVar4 = chck_buffer_read_int(tests_1 + 1,4,uncompressed + 0x10);
        if ((uVar4 & 1) == 0) {
          __assert_fail("chck_buffer_read_int(&i, sizeof(i), &buf)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x7d,"int main(void)");
        }
        if (tests_1[1] != 8) {
          __assert_fail("i == 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x7e,"int main(void)");
        }
        uVar4 = chck_buffer_read_int((byte *)((long)tests_1 + 2),2,uncompressed + 0x10);
        if ((uVar4 & 1) == 0) {
          __assert_fail("chck_buffer_read_int(&s, sizeof(s), &buf)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x7f,"int main(void)");
        }
        if (tests_1[0]._2_2_ != 6) {
          __assert_fail("s == 6",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x80,"int main(void)");
        }
        if (buf_4.buffer + -(long)stack0xfffffffffffffe50 != buf_4.curpos) {
          __assert_fail("(buf.curpos - buf.buffer) - buf.size == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                        ,0x81,"int main(void)");
        }
        chck_buffer_release(uncompressed + 0x10);
        str_1._4_4_ = str_1._4_4_ + 1;
      }
      __assert_fail("(buf.curpos - buf.buffer) - buf.size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x72,"int main(void)");
    }
    uVar4 = chck_buffer_from_pointer
                      (&len,*(undefined8 *)(&i + (long)iStack_11c * 6),tests[iStack_11c].data,
                       (int)tests[iStack_11c].size);
    if ((uVar4 & 1) == 0) {
      __assert_fail("chck_buffer_from_pointer(&buf, tests[t].data, tests[t].size, tests[t].endianess)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x49,"int main(void)");
    }
    if ((uint)((byte)buf_3.step & 1) != (uint)tests[iStack_11c].size) {
      __assert_fail("buf.endianess == tests[t].endianess",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x4a,"int main(void)");
    }
    uVar4 = chck_buffer_read_string(&buf_3.endianess,&l,&len);
    if ((uVar4 & 1) == 0) {
      __assert_fail("chck_buffer_read_string(&str, &len, &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x4c,"int main(void)");
    }
    if (l != 0x12) {
      __assert_fail("len == strlen(\"this integer is 5:\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x4d,"int main(void)");
    }
    iVar3 = strcmp((char *)buf_3._32_8_,"this integer is 5:");
    if (iVar3 != 0) {
      __assert_fail("!strcmp(str, \"this integer is 5:\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x4e,"int main(void)");
    }
    free((void *)buf_3._32_8_);
    uVar4 = chck_buffer_read_string_of_type(&buf_3.endianess,0,1,&len);
    if ((uVar4 & 1) == 0) {
      __assert_fail("chck_buffer_read_string_of_type(&str, NULL, sizeof(uint8_t), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x4f,"int main(void)");
    }
    iVar3 = strcmp((char *)buf_3._32_8_,"this integer is 5:");
    if (iVar3 != 0) {
      __assert_fail("strcmp(str, \"this integer is 5:\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x50,"int main(void)");
    }
    free((void *)buf_3._32_8_);
    uVar4 = chck_buffer_read_int(&local_120,4,&len);
    if ((uVar4 & 1) == 0) break;
    if (local_120 != 5) {
      __assert_fail("i == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x52,"int main(void)");
    }
    uVar4 = chck_buffer_read_int((long)&str + 6,2,&len);
    if ((uVar4 & 1) == 0) {
      __assert_fail("chck_buffer_read_int(&s, sizeof(s), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x53,"int main(void)");
    }
    if (str._6_2_ != 1) {
      __assert_fail("s == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x54,"int main(void)");
    }
    uVar4 = chck_buffer_read_int((long)&str + 5,1,&len);
    if ((uVar4 & 1) == 0) {
      __assert_fail("chck_buffer_read_int(&c, sizeof(c), &buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x55,"int main(void)");
    }
    if (str._5_1_ != '\x01') {
      __assert_fail("c == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x56,"int main(void)");
    }
    if (buf_3.buffer + -len != buf_3.curpos) {
      __assert_fail("(buf.curpos - buf.buffer) - buf.size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                    ,0x57,"int main(void)");
    }
    chck_buffer_release(&len);
    iStack_11c = iStack_11c + 1;
  }
  __assert_fail("chck_buffer_read_int(&i, sizeof(i), &buf)",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/test.c"
                ,0x51,"int main(void)");
}

Assistant:

int main(void)
{
   /* TEST: ownership move */
   {
      struct chck_buffer buf;
      assert(chck_buffer(&buf, 1, CHCK_ENDIANESS_NATIVE));
      buf.copied = false;
      free(buf.buffer);
      chck_buffer_release(&buf); // should not SIGSEGV
   }

   /* TEST: over-read */
   {
      struct chck_buffer buf;
      char data[] = "yolo I have only this many bytes";
      assert(chck_buffer_from_pointer(&buf, data, sizeof(data), CHCK_ENDIANESS_NATIVE));
      char bb[sizeof(data)];
      assert(chck_buffer_read(bb, 1, sizeof(data), &buf) == sizeof(data));
      chck_buffer_seek(&buf, 0, SEEK_SET);
      assert(chck_buffer_read(bb, 1, sizeof(data) * 4, &buf) == sizeof(data));
      chck_buffer_seek(&buf, 0, SEEK_SET);
      assert(chck_buffer_read(bb, 8, sizeof(data), &buf) == 4);
      assert(chck_buffer_read(bb, 12, sizeof(data), &buf) == 0);
      assert(chck_buffer_read(bb, 1, sizeof(data), &buf) == 1);
      chck_buffer_release(&buf);
   }

   /* TEST: writing format */
   {
      struct chck_buffer buf;
      assert(chck_buffer(&buf, 1, CHCK_ENDIANESS_NATIVE));
      const char *result = "Hello buffer, I'm in your buffer at 10:00 clock!";
      assert(chck_buffer_write_format(&buf, "Hello %s, I'm in your buffer at %d:%.2d clock!", "buffer", 10, 0) == strlen(result));
      chck_buffer_seek(&buf, 0, SEEK_SET);
      assert(!memcmp(buf.buffer, result, strlen(result)));
      chck_buffer_release(&buf);

   }

   /* TEST: little endian buffer */
   {
      const struct {
         char *data;
         size_t size;
         enum chck_endianess endianess;
      } tests[] = {
         {
            .data = "\x1\x12this integer is 5:\x12this integer is 5:\x5\x0\x0\0\1\0\1",
            .size = sizeof("\x0\x12this integer is 5:\x12this integer is 5:\x5\x0\x0\0\1\0\1") - 1,
            .endianess = CHCK_ENDIANESS_LITTLE,
         }, {
            .data = "\x1\x12this integer is 5:\x12this integer is 5:\x0\x0\0\x5\0\1\1",
            .size = sizeof("\x0\x12this integer is 5:\x12this integer is 5:\x0\x0\0\x5\0\1\1") - 1,
            .endianess = CHCK_ENDIANESS_BIG,
         },
      };

      for (int t = 0; t < 2; ++t) {
         int32_t i;
         int16_t s;
         int8_t c;
         char *str;
         struct chck_buffer buf;
         assert(chck_buffer_from_pointer(&buf, tests[t].data, tests[t].size, tests[t].endianess));
         assert(buf.endianess == tests[t].endianess);
         size_t len;
         assert(chck_buffer_read_string(&str, &len, &buf));
         assert(len == strlen("this integer is 5:"));
         assert(!strcmp(str, "this integer is 5:")); free(str);
         assert(chck_buffer_read_string_of_type(&str, NULL, sizeof(uint8_t), &buf));
         assert(strcmp(str, "this integer is 5:") == 0); free(str);
         assert(chck_buffer_read_int(&i, sizeof(i), &buf));
         assert(i == 5);
         assert(chck_buffer_read_int(&s, sizeof(s), &buf));
         assert(s == 1);
         assert(chck_buffer_read_int(&c, sizeof(c), &buf));
         assert(c == 1);
         assert((buf.curpos - buf.buffer) - buf.size == 0);
         chck_buffer_release(&buf);
      }
   }

   /* TEST: buffer write && read && resize */
   {
      int64_t l = 32;
      int32_t i = 8;
      int16_t s = 6;
      enum chck_endianess tests[] = { CHCK_ENDIANESS_NATIVE, !chck_endianess() };
      for (int t = 0; t < 2; ++t) {
         char *str;
         struct chck_buffer buf;
         assert(chck_buffer(&buf, 5+6, tests[t]));
         assert((tests[t] == CHCK_ENDIANESS_NATIVE) == chck_buffer_native_endianess(&buf));

         assert(chck_buffer_write_string("test", 4, &buf) == 1);
         assert(chck_buffer_write_string_of_type("test", 4, sizeof(uint8_t), &buf));
         assert(chck_buffer_resize(&buf, 5+6+sizeof(uint64_t)+sizeof(int32_t)+sizeof(int16_t)));
         assert(buf.size == 5+6+sizeof(uint64_t)+sizeof(int32_t)+sizeof(int16_t));
         assert(buf.curpos - buf.buffer == 6+5);
         assert(buf.buffer != buf.curpos);

         assert(chck_buffer_write_int(&l, sizeof(l), &buf));
         assert(chck_buffer_write_int(&i, sizeof(i), &buf));
         assert(chck_buffer_write_int(&s, sizeof(s), &buf));
         assert((buf.curpos - buf.buffer) - buf.size == 0);

         assert(chck_buffer_seek(&buf, 0, SEEK_SET) == buf.curpos - buf.buffer);
         assert(buf.curpos - buf.buffer == 0);

         assert(chck_buffer_read_string(&str, NULL, &buf));
         assert(strcmp(str, "test") == 0); free(str);
         assert(chck_buffer_read_string_of_type(&str, NULL, sizeof(uint8_t), &buf));
         assert(strcmp(str, "test") == 0); free(str);
         assert(chck_buffer_read_int(&l, sizeof(l), &buf));
         assert(l == 32);
         assert(chck_buffer_read_int(&i, sizeof(i), &buf));
         assert(i == 8);
         assert(chck_buffer_read_int(&s, sizeof(s), &buf));
         assert(s == 6);
         assert((buf.curpos - buf.buffer) - buf.size == 0);
         chck_buffer_release(&buf);
      }
   }

   /* TEST: zlib compression && decompression */
   {
      char uncompressed[] = ".....................";
      struct chck_buffer buf;
      chck_buffer_from_pointer(&buf, uncompressed, sizeof(uncompressed), CHCK_ENDIANESS_NATIVE);
#if HAS_ZLIB
      uint8_t compressed[] = { 0x78, 0x9c, 0xd3, 0xd3, 0xc3, 0x2, 0x18, 0x0, 0x2d, 0x5e, 0x3, 0xc7 };
      assert(chck_buffer_has_zlib());
      assert(chck_buffer_compress_zlib(&buf));
      assert(buf.size == sizeof(compressed));
      assert(memcmp(buf.buffer, compressed, sizeof(compressed)) == 0);

      assert(chck_buffer_decompress_zlib(&buf));
      assert(buf.size == sizeof(uncompressed));
      assert(memcmp(buf.buffer, uncompressed, sizeof(uncompressed)) == 0);
#else
      assert(!chck_buffer_has_zlib());
      assert(!chck_buffer_compress_zlib(&buf));
      assert(!chck_buffer_decompress_zlib(&buf));
#endif
      chck_buffer_release(&buf);
   }

   /* TEST: benchmark read/write (small writes, native && non-native) */
   {
      const uint32_t iters = 0xFFFFF;
      enum chck_endianess tests[] = { CHCK_ENDIANESS_NATIVE, !chck_endianess() };
      for (int i = 0; i < 2; ++i) {
         struct chck_buffer buf;
         assert(chck_buffer(&buf, iters * sizeof(uint64_t) * sizeof(uint32_t) * sizeof(uint16_t) * sizeof(uint8_t), tests[i]));
         for (uint64_t a = 0; a < iters; ++a) assert(chck_buffer_write_int(&a, sizeof(a), &buf));
         for (uint32_t a = 0; a < iters; ++a) assert(chck_buffer_write_int(&a, sizeof(a), &buf));
         for (uint16_t a = 0; a < 0xFFFF; ++a) assert(chck_buffer_write_int(&a, sizeof(a), &buf));
         for (uint8_t a = 0; a < 0xFF; ++a) assert(chck_buffer_write_int(&a, sizeof(a), &buf));
         for (uint32_t a = 0; a < iters; ++a) assert(chck_buffer_write_string("yolo", 4, &buf));
         chck_buffer_seek(&buf, 0, SEEK_SET);
         for (uint64_t t, a = 0; a < iters; ++a) { assert(chck_buffer_read_int(&t, sizeof(t), &buf)); assert(a == t); }
         for (uint32_t t, a = 0; a < iters; ++a) { assert(chck_buffer_read_int(&t, sizeof(t), &buf)); assert(a == t); }
         for (uint16_t t, a = 0; a < 0xFFFF; ++a) { assert(chck_buffer_read_int(&t, sizeof(t), &buf)); assert(a == t); }
         for (uint8_t t, a = 0; a < 0xFF; ++a) { assert(chck_buffer_read_int(&t, sizeof(t), &buf)); assert(a == t); }
         for (uint32_t a = 0; a < iters; ++a) {
            char *t;
            size_t len;
            assert(chck_buffer_read_string(&t, &len, &buf));
            assert(!strcmp(t, "yolo"));
            assert(len == 4);
            free(t);
         }
         chck_buffer_release(&buf);
      }
   }

   return EXIT_SUCCESS;
}